

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O3

void __thiscall
ON_SubDManagedMeshFragment::CopyHelper(ON_SubDManagedMeshFragment *this,ON_SubDMeshFragment *src)

{
  anon_union_4_2_6147a14e_for_ON_Color_15 *paVar1;
  undefined2 uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  uint *puVar9;
  uint *puVar10;
  ON_SubDMeshFragmentGrid *pOVar11;
  ON_SubDMeshFragmentGrid *pOVar12;
  ON_3dVector quad_normal;
  byte bVar13;
  bool bVar14;
  bool bVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  unsigned_short uVar19;
  unsigned_short uVar20;
  unsigned_short uVar21;
  ON__UINT16 OVar22;
  ON__UINT32 OVar23;
  bool bVar24;
  ushort uVar25;
  ushort uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  size_t sVar30;
  double *pdVar31;
  double *pdVar32;
  ON_SurfaceCurvature *pOVar33;
  ON_Color *pOVar34;
  double *pdVar35;
  uint uVar36;
  size_t sVar37;
  long lVar38;
  ON_SurfaceCurvature *pOVar39;
  anon_union_4_2_6147a14e_for_ON_Color_15 *paVar40;
  ON_SurfaceCurvature *pOVar41;
  ushort uVar42;
  uint uVar43;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  double nan3 [3];
  ON_3dPoint quad_points [4];
  double local_d8;
  double local_d0;
  double local_c8;
  ulong local_b8;
  ON_3dVector local_b0;
  ON_3dPoint local_98 [4];
  ulong uVar44;
  
  if (this != (ON_SubDManagedMeshFragment *)src) {
    ON_SubDMeshFragment::Clear(&this->super_ON_SubDMeshFragment);
    uVar43 = src->m_vertex_count_etc & 0x1fff;
    uVar44 = (ulong)uVar43;
    if ((src->m_vertex_count_etc & 0x1fff) != 0) {
      bVar47 = src->m_P == (double *)0x0;
      bVar45 = src->m_P_stride < 3;
      bVar48 = src->m_N == (double *)0x0;
      bVar46 = src->m_N_stride < 3;
      uVar27 = ON_SubDMeshFragment::TextureCoordinateCount(src);
      bVar14 = true;
      bVar13 = 1;
      if (uVar27 != 0) {
        if (uVar27 == uVar43) {
          bVar13 = 0;
        }
        else {
          ON_SubDIncrementErrorCount();
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
                     ,0x4af,"","invalid src.TextureCoordinateCount()");
          bVar13 = 1;
        }
      }
      uVar27 = (uint)src->m_vertex_capacity_etc;
      uVar25 = src->m_vertex_count_etc & 0x1fff;
      uVar42 = (ushort)uVar43;
      if ((uVar25 != 0 && src->m_K_stride != 0) &&
          (src->m_K != (ON_SurfaceCurvature *)0x0 && (src->m_vertex_capacity_etc >> 0xe & 1) != 0))
      {
        if (uVar42 == uVar25) {
          bVar14 = false;
        }
        else {
          ON_SubDIncrementErrorCount();
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
                     ,0x4b6,"","invalid src.CurvatureCount()");
          uVar27 = (uint)src->m_vertex_capacity_etc;
          uVar25 = src->m_vertex_count_etc & 0x1fff;
        }
      }
      bVar15 = true;
      if (uVar25 != 0 &&
          (src->m_C_stride != 0 && (src->m_C != (ON_Color *)0x0 && (uVar27 >> 0xd & 1) != 0))) {
        if (uVar42 == uVar25) {
          bVar15 = false;
        }
        else {
          ON_SubDIncrementErrorCount();
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
                     ,0x4bd,"","invalid src.ColorCount()");
        }
      }
      uVar25 = (this->super_ON_SubDMeshFragment).m_vertex_capacity_etc;
      uVar26 = uVar25 & 0x1fff;
      if (uVar26 < uVar42) {
        if (((-1 < (short)uVar25) && (uVar26 != 0)) &&
           ((this->super_ON_SubDMeshFragment).m_P != (double *)0x0)) {
          ON_SubDIncrementErrorCount();
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
                     ,0x4c6,"","unmanaged array capacity is too small.");
          return;
        }
        bVar24 = ON_SubDMeshFragment::ManagedArrays(&this->super_ON_SubDMeshFragment);
        if (bVar24) {
          ON_SubDMeshFragment::DeleteManagedArrays(&this->super_ON_SubDMeshFragment);
        }
        (this->super_ON_SubDMeshFragment).m_vertex_count_etc = 0;
        (this->super_ON_SubDMeshFragment).m_vertex_capacity_etc = 0;
        (this->super_ON_SubDMeshFragment).m_P = (double *)0x0;
        ON_SubDMeshFragment::Internal_LayoutArrays
                  (&this->super_ON_SubDMeshFragment,uVar44,(double *)0x0);
      }
      uVar28 = ON_SubDMeshFragment::TextureCoordinateCapacity(&this->super_ON_SubDMeshFragment);
      uVar36 = (this->super_ON_SubDMeshFragment).m_vertex_capacity_etc & 0x1fff;
      uVar29 = 0;
      uVar27 = uVar36;
      if ((this->super_ON_SubDMeshFragment).m_K_stride == 0) {
        uVar27 = uVar29;
      }
      if ((this->super_ON_SubDMeshFragment).m_K == (ON_SurfaceCurvature *)0x0) {
        uVar27 = uVar29;
      }
      if ((this->super_ON_SubDMeshFragment).m_C_stride == 0) {
        uVar36 = uVar29;
      }
      if ((this->super_ON_SubDMeshFragment).m_C == (ON_Color *)0x0) {
        uVar36 = uVar29;
      }
      local_b8 = uVar44;
      ON_SubDMeshFragment::SetVertexCount(&this->super_ON_SubDMeshFragment,uVar44);
      uVar44 = local_b8;
      uVar2 = src->m_vertex_count_etc;
      (this->super_ON_SubDMeshFragment).m_vertex_count_etc =
           uVar2 & 0x8000 | (this->super_ON_SubDMeshFragment).m_vertex_count_etc & 0x7fff;
      bVar24 = (bool)(bVar13 | uVar28 < uVar43);
      if (!bVar24) {
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[0][0] = src->m_ctrlnetT[0][0];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[0][1] = src->m_ctrlnetT[0][1];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[0][2] = src->m_ctrlnetT[0][2];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[1][0] = src->m_ctrlnetT[1][0];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[1][1] = src->m_ctrlnetT[1][1];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[1][2] = src->m_ctrlnetT[1][2];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[2][0] = src->m_ctrlnetT[2][0];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[2][1] = src->m_ctrlnetT[2][1];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[2][2] = src->m_ctrlnetT[2][2];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[3][0] = src->m_ctrlnetT[3][0];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[3][1] = src->m_ctrlnetT[3][1];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[3][2] = src->m_ctrlnetT[3][2];
      }
      uVar43 = (uint)local_b8;
      if (!bVar14 && uVar43 <= uVar27) {
        dVar4 = src->m_ctrlnetK[0].k2;
        (this->super_ON_SubDMeshFragment).m_ctrlnetK[0].k1 = src->m_ctrlnetK[0].k1;
        (this->super_ON_SubDMeshFragment).m_ctrlnetK[0].k2 = dVar4;
        dVar4 = src->m_ctrlnetK[1].k2;
        (this->super_ON_SubDMeshFragment).m_ctrlnetK[1].k1 = src->m_ctrlnetK[1].k1;
        (this->super_ON_SubDMeshFragment).m_ctrlnetK[1].k2 = dVar4;
        dVar4 = src->m_ctrlnetK[2].k2;
        (this->super_ON_SubDMeshFragment).m_ctrlnetK[2].k1 = src->m_ctrlnetK[2].k1;
        (this->super_ON_SubDMeshFragment).m_ctrlnetK[2].k2 = dVar4;
        dVar4 = src->m_ctrlnetK[3].k2;
        (this->super_ON_SubDMeshFragment).m_ctrlnetK[3].k1 = src->m_ctrlnetK[3].k1;
        (this->super_ON_SubDMeshFragment).m_ctrlnetK[3].k2 = dVar4;
      }
      if (!bVar15 && uVar43 <= uVar36) {
        (this->super_ON_SubDMeshFragment).m_ctrlnetC[0].field_0 = src->m_ctrlnetC[0].field_0;
        (this->super_ON_SubDMeshFragment).m_ctrlnetC[1].field_0 = src->m_ctrlnetC[1].field_0;
        (this->super_ON_SubDMeshFragment).m_ctrlnetC[2].field_0 = src->m_ctrlnetC[2].field_0;
        (this->super_ON_SubDMeshFragment).m_ctrlnetC[3].field_0 = src->m_ctrlnetC[3].field_0;
      }
      (this->super_ON_SubDMeshFragment).m_pack_rect[0][0] = src->m_pack_rect[0][0];
      (this->super_ON_SubDMeshFragment).m_pack_rect[0][1] = src->m_pack_rect[0][1];
      (this->super_ON_SubDMeshFragment).m_pack_rect[1][0] = src->m_pack_rect[1][0];
      (this->super_ON_SubDMeshFragment).m_pack_rect[1][1] = src->m_pack_rect[1][1];
      (this->super_ON_SubDMeshFragment).m_pack_rect[2][0] = src->m_pack_rect[2][0];
      (this->super_ON_SubDMeshFragment).m_pack_rect[2][1] = src->m_pack_rect[2][1];
      (this->super_ON_SubDMeshFragment).m_pack_rect[3][0] = src->m_pack_rect[3][0];
      (this->super_ON_SubDMeshFragment).m_pack_rect[3][1] = src->m_pack_rect[3][1];
      dVar4 = (src->m_surface_bbox).m_min.y;
      dVar5 = (src->m_surface_bbox).m_min.z;
      dVar6 = (src->m_surface_bbox).m_max.x;
      dVar7 = (src->m_surface_bbox).m_max.y;
      dVar8 = (src->m_surface_bbox).m_max.z;
      (this->super_ON_SubDMeshFragment).m_surface_bbox.m_min.x = (src->m_surface_bbox).m_min.x;
      (this->super_ON_SubDMeshFragment).m_surface_bbox.m_min.y = dVar4;
      (this->super_ON_SubDMeshFragment).m_surface_bbox.m_min.z = dVar5;
      (this->super_ON_SubDMeshFragment).m_surface_bbox.m_max.x = dVar6;
      (this->super_ON_SubDMeshFragment).m_surface_bbox.m_max.y = dVar7;
      (this->super_ON_SubDMeshFragment).m_surface_bbox.m_max.z = dVar8;
      uVar16 = (src->m_grid).m_reserved2;
      uVar17 = (src->m_grid).m_side_segment_count;
      uVar18 = (src->m_grid).m_reserved3;
      uVar19 = (src->m_grid).m_F_count;
      uVar20 = (src->m_grid).m_F_level_of_detail;
      uVar21 = (src->m_grid).m_F_stride;
      OVar22 = (src->m_grid).m_reserved4;
      OVar23 = (src->m_grid).m_reserved5;
      puVar9 = (src->m_grid).m_F;
      puVar10 = (src->m_grid).m_S;
      pOVar11 = (src->m_grid).m_prev_level_of_detail;
      pOVar12 = (src->m_grid).m_next_level_of_detail;
      (this->super_ON_SubDMeshFragment).m_grid.m_reserved1 = (src->m_grid).m_reserved1;
      (this->super_ON_SubDMeshFragment).m_grid.m_reserved2 = uVar16;
      (this->super_ON_SubDMeshFragment).m_grid.m_side_segment_count = uVar17;
      (this->super_ON_SubDMeshFragment).m_grid.m_reserved3 = uVar18;
      (this->super_ON_SubDMeshFragment).m_grid.m_F_count = uVar19;
      (this->super_ON_SubDMeshFragment).m_grid.m_F_level_of_detail = uVar20;
      (this->super_ON_SubDMeshFragment).m_grid.m_F_stride = uVar21;
      (this->super_ON_SubDMeshFragment).m_grid.m_reserved4 = OVar22;
      (this->super_ON_SubDMeshFragment).m_grid.m_reserved5 = OVar23;
      (this->super_ON_SubDMeshFragment).m_grid.m_F = puVar9;
      (this->super_ON_SubDMeshFragment).m_grid.m_S = puVar10;
      (this->super_ON_SubDMeshFragment).m_grid.m_prev_level_of_detail = pOVar11;
      (this->super_ON_SubDMeshFragment).m_grid.m_next_level_of_detail = pOVar12;
      sVar37 = 0;
      ON_SubDMeshFragment::GetControlNetQuad(src,false,local_98,&local_b0);
      quad_normal.y = local_b0.y;
      quad_normal.x = local_b0.x;
      quad_normal.z = local_b0.z;
      ON_SubDMeshFragment::SetControlNetQuad
                (&this->super_ON_SubDMeshFragment,false,local_98,quad_normal);
      local_d8 = ON_DBL_QNAN;
      local_d0 = ON_DBL_QNAN;
      local_c8 = ON_DBL_QNAN;
      sVar30 = (this->super_ON_SubDMeshFragment).m_P_stride;
      lVar38 = sVar30 * uVar44;
      if (!bVar47 && !bVar45) {
        sVar37 = src->m_P_stride;
      }
      if (0 < lVar38) {
        pdVar31 = (this->super_ON_SubDMeshFragment).m_P;
        if (bVar47 || bVar45) {
          pdVar35 = &local_d8;
        }
        else {
          pdVar35 = src->m_P;
        }
        pdVar32 = pdVar31 + lVar38;
        pdVar35 = pdVar35 + 2;
        do {
          *pdVar31 = pdVar35[-2];
          pdVar31[1] = pdVar35[-1];
          pdVar31[2] = *pdVar35;
          pdVar31 = pdVar31 + sVar30;
          pdVar35 = pdVar35 + sVar37;
        } while (pdVar31 < pdVar32);
      }
      if (bVar48 || bVar46) {
        sVar30 = 0;
      }
      else {
        sVar30 = src->m_N_stride;
      }
      pdVar31 = (this->super_ON_SubDMeshFragment).m_N;
      uVar3 = (this->super_ON_SubDMeshFragment).m_N_stride;
      uVar28 = (this->super_ON_SubDMeshFragment).m_vertex_capacity_etc & 0x1fff;
      if (uVar3 < 3) {
        uVar28 = 0;
      }
      if (pdVar31 == (double *)0x0) {
        uVar28 = 0;
      }
      if ((uVar43 <= uVar28) && (0 < (long)(uVar3 * uVar44))) {
        if (bVar48 || bVar46) {
          pdVar35 = &local_d8;
        }
        else {
          pdVar35 = src->m_N;
        }
        pdVar32 = pdVar31 + uVar3 * uVar44;
        pdVar35 = pdVar35 + 2;
        do {
          *pdVar31 = pdVar35[-2];
          pdVar31[1] = pdVar35[-1];
          pdVar31[2] = *pdVar35;
          pdVar31 = pdVar31 + uVar3;
          pdVar35 = pdVar35 + sVar30;
        } while (pdVar31 < pdVar32);
      }
      if (bVar24) {
        pdVar31 = &local_d8;
        sVar30 = 0;
      }
      else {
        pdVar31 = src->m_T;
        sVar30 = src->m_T_stride;
        ON_SubDMeshFragment::SetTextureCoordinatesExistForExperts
                  (&this->super_ON_SubDMeshFragment,true);
      }
      uVar28 = ON_SubDMeshFragment::TextureCoordinateCapacity(&this->super_ON_SubDMeshFragment);
      if (uVar43 <= uVar28) {
        sVar37 = (this->super_ON_SubDMeshFragment).m_T_stride;
        lVar38 = sVar37 * uVar44;
        if (0 < lVar38) {
          pdVar32 = (this->super_ON_SubDMeshFragment).m_T;
          pdVar35 = pdVar32 + lVar38;
          pdVar31 = pdVar31 + 2;
          do {
            *pdVar32 = pdVar31[-2];
            pdVar32[1] = pdVar31[-1];
            pdVar32[2] = *pdVar31;
            pdVar32 = pdVar32 + sVar37;
            pdVar31 = pdVar31 + sVar30;
          } while (pdVar32 < pdVar35);
        }
      }
      uVar25 = (this->super_ON_SubDMeshFragment).m_vertex_capacity_etc;
      uVar28 = (uint)uVar25;
      if (!bVar14 && uVar43 <= uVar27) {
        pOVar33 = src->m_K;
        sVar30 = src->m_K_stride;
        uVar28 = uVar25 | 0x4000;
        (this->super_ON_SubDMeshFragment).m_vertex_capacity_etc = (unsigned_short)uVar28;
      }
      else {
        pOVar33 = &ON_SurfaceCurvature::Nan;
        sVar30 = 0;
      }
      pOVar39 = (this->super_ON_SubDMeshFragment).m_K;
      sVar37 = (this->super_ON_SubDMeshFragment).m_K_stride;
      uVar27 = uVar28 & 0x1fff;
      if (sVar37 == 0) {
        uVar27 = 0;
      }
      if (pOVar39 == (ON_SurfaceCurvature *)0x0) {
        uVar27 = 0;
      }
      if ((uVar43 <= uVar27) && (lVar38 = sVar37 * uVar44, 0 < lVar38)) {
        pOVar41 = pOVar39 + lVar38;
        do {
          dVar4 = pOVar33->k2;
          pOVar39->k1 = pOVar33->k1;
          pOVar39->k2 = dVar4;
          pOVar39 = pOVar39 + (this->super_ON_SubDMeshFragment).m_K_stride;
          pOVar33 = pOVar33 + sVar30;
        } while (pOVar39 < pOVar41);
        uVar28 = (uint)(this->super_ON_SubDMeshFragment).m_vertex_capacity_etc;
      }
      if (!bVar15 && uVar43 <= uVar36) {
        pOVar34 = src->m_C;
        sVar30 = src->m_C_stride;
        uVar28 = uVar28 | 0x2000;
        (this->super_ON_SubDMeshFragment).m_vertex_capacity_etc = (unsigned_short)uVar28;
      }
      else {
        pOVar34 = &ON_Color::UnsetColor;
        sVar30 = 0;
      }
      paVar40 = &((this->super_ON_SubDMeshFragment).m_C)->field_0;
      sVar37 = (this->super_ON_SubDMeshFragment).m_C_stride;
      uVar27 = uVar28 & 0x1fff;
      if (sVar37 == 0) {
        uVar27 = 0;
      }
      if (paVar40 == (anon_union_4_2_6147a14e_for_ON_Color_15 *)0x0) {
        uVar27 = 0;
      }
      if ((uVar43 <= uVar27) && (lVar38 = sVar37 * uVar44, 0 < lVar38)) {
        paVar1 = paVar40 + lVar38;
        do {
          *paVar40 = pOVar34->field_0;
          paVar40 = paVar40 + (this->super_ON_SubDMeshFragment).m_C_stride;
          pOVar34 = (ON_Color *)(&pOVar34->field_0 + sVar30);
        } while (paVar40 < paVar1);
      }
    }
  }
  return;
}

Assistant:

void ON_SubDManagedMeshFragment::CopyHelper(const ON_SubDMeshFragment& src)
{
  // This makes an exact copy. 
  // See ON_SubDMeshFragment::CopyFrom() can copy high density to low density

  if (this == &src)
    return;
  
  ON_SubDMeshFragment::Clear();

  const size_t vertex_capacity = src.VertexCount();
  if (0 == vertex_capacity)
    return;

  const unsigned P_count = src.PointCount();
  if (0 != P_count && vertex_capacity != P_count)
  {
    ON_SUBD_ERROR("invalid counts");
    return;
  }

  unsigned N_count = src.NormalCount();
  if (0 != N_count && vertex_capacity != N_count)
  {
    ON_SUBD_ERROR("invalid src.NormalCount()");
    N_count = 0;
  }

  unsigned T_count = src.TextureCoordinateCount();
  if (0 != T_count && vertex_capacity != T_count)
  {
    ON_SUBD_ERROR("invalid src.TextureCoordinateCount()");
    T_count = 0;
  }

  unsigned K_count = src.CurvatureCount();
  if (0 != K_count && vertex_capacity != K_count)
  {
    ON_SUBD_ERROR("invalid src.CurvatureCount()");
    K_count = 0;
  }

  unsigned C_count = src.ColorCount();
  if (0 != C_count && vertex_capacity != C_count)
  {
    ON_SUBD_ERROR("invalid src.ColorCount()");
    C_count = 0;
  }


  if (vertex_capacity > this->VertexCapacity())
  {
    if (this->UnmanagedArrays() && this->VertexCapacity() > 0)
    {
      ON_SUBD_ERROR("unmanaged array capacity is too small.");
      return;
    }
    
    if (this->ManagedArrays())
      this->DeleteManagedArrays();

    // allocate managed arrays
    m_vertex_count_etc = 0;
    m_vertex_capacity_etc = 0;
    m_P = nullptr;
    this->Internal_LayoutArrays(vertex_capacity, nullptr);
  }

  if (this->TextureCoordinateCapacity() < vertex_capacity)
    T_count = 0;
  if (this->CurvatureCapacity() < vertex_capacity)
    K_count = 0;
  if (this->ColorCapacity() < vertex_capacity)
    C_count = 0;

  SetVertexCount(vertex_capacity);

  if (src.m_vertex_count_etc & ON_SubDMeshFragment::EtcControlNetQuadBit)
  {
    m_vertex_count_etc |= ON_SubDMeshFragment::EtcControlNetQuadBit;
  } 
  else
  {
    m_vertex_count_etc &= ~ON_SubDMeshFragment::EtcControlNetQuadBit;
  }

  if (T_count > 0)
  {
    m_ctrlnetT[0][0] = src.m_ctrlnetT[0][0];
    m_ctrlnetT[0][1] = src.m_ctrlnetT[0][1];
    m_ctrlnetT[0][2] = src.m_ctrlnetT[0][2];
    m_ctrlnetT[1][0] = src.m_ctrlnetT[1][0];
    m_ctrlnetT[1][1] = src.m_ctrlnetT[1][1];
    m_ctrlnetT[1][2] = src.m_ctrlnetT[1][2];
    m_ctrlnetT[2][0] = src.m_ctrlnetT[2][0];
    m_ctrlnetT[2][1] = src.m_ctrlnetT[2][1];
    m_ctrlnetT[2][2] = src.m_ctrlnetT[2][2];
    m_ctrlnetT[3][0] = src.m_ctrlnetT[3][0];
    m_ctrlnetT[3][1] = src.m_ctrlnetT[3][1];
    m_ctrlnetT[3][2] = src.m_ctrlnetT[3][2];
  }

  if (K_count > 0)
  {
    m_ctrlnetK[0] = src.m_ctrlnetK[0];
    m_ctrlnetK[1] = src.m_ctrlnetK[1];
    m_ctrlnetK[2] = src.m_ctrlnetK[2];
    m_ctrlnetK[3] = src.m_ctrlnetK[3];
  }

  if (C_count > 0)
  {
    m_ctrlnetC[0] = src.m_ctrlnetC[0];
    m_ctrlnetC[1] = src.m_ctrlnetC[1];
    m_ctrlnetC[2] = src.m_ctrlnetC[2];
    m_ctrlnetC[3] = src.m_ctrlnetC[3];
  }

  m_pack_rect[0][0] = src.m_pack_rect[0][0];
  m_pack_rect[0][1] = src.m_pack_rect[0][1];
  m_pack_rect[1][0] = src.m_pack_rect[1][0];
  m_pack_rect[1][1] = src.m_pack_rect[1][1];
  m_pack_rect[2][0] = src.m_pack_rect[2][0];
  m_pack_rect[2][1] = src.m_pack_rect[2][1];
  m_pack_rect[3][0] = src.m_pack_rect[3][0];
  m_pack_rect[3][1] = src.m_pack_rect[3][1];

  this->m_surface_bbox = src.m_surface_bbox;
  this->m_grid = src.m_grid;

  ON_3dPoint quad_points[4];
  ON_3dVector quad_normal;
  src.GetControlNetQuad(false, quad_points, quad_normal);
  this->SetControlNetQuad(false, quad_points, quad_normal);


  const double nan3[3] = { ON_DBL_QNAN, ON_DBL_QNAN, ON_DBL_QNAN };
  const double* src_p;
  size_t src_p_stride;
  double* p;
  double* p1;

  // copy src.m_P[] to m_P[]
  p = m_P;
  p1 = p + (m_P_stride * vertex_capacity);
  if ( P_count > 0 )
  {
    src_p = src.m_P;
    src_p_stride = src.m_P_stride;
  }
  else
  {
    src_p = nan3;
    src_p_stride = 0;
  }
  while (p < p1)
  {
    p[0] = src_p[0];
    p[1] = src_p[1];
    p[2] = src_p[2];
    p += m_P_stride;
    src_p += src_p_stride;
  }

  // copy src.m_N[] to m_N[]
  if (N_count > 0)
  {
    src_p = src.m_N;
    src_p_stride = src.m_N_stride;
  }
  else
  {
    // Pierre, 2023-04-13: Set to Nan when empty source, to stay similar to ON_SubDMeshFragment::CopyFrom()
    src_p = nan3;
    src_p_stride = 0;
  }
  if (this->NormalCapacity() >= vertex_capacity)
  {
    p = m_N;
    p1 = p + (m_N_stride * vertex_capacity);
    while (p < p1)
    {
      p[0] = src_p[0];
      p[1] = src_p[1];
      p[2] = src_p[2];
      p += m_N_stride;
      src_p += src_p_stride;
    }
  }

  // copy src.m_T[] to m_T[]
  if (T_count > 0)
  {
    src_p = src.m_T;
    src_p_stride = src.m_T_stride;
    SetTextureCoordinatesExistForExperts(true);
  }
  else
  {
    // set m_T[] to nans
    src_p = nan3;
    src_p_stride = 0;
  }
  if (this->TextureCoordinateCapacity() >= vertex_capacity)
  {
    p = m_T;
    p1 = p + (m_T_stride * vertex_capacity);
    while (p < p1)
    {
      p[0] = src_p[0];
      p[1] = src_p[1];
      p[2] = src_p[2];
      p += m_T_stride;
      src_p += src_p_stride;
    }
  }

  // copy src.m_K[] to m_K[]
  const ON_SurfaceCurvature* src_k;
  size_t src_k_stride;
  if (K_count > 0)
  {
    // copy curvature
    src_k = src.m_K;
    src_k_stride = src.m_K_stride;
    SetCurvaturesExistForExperts(true);
  }
  else
  {
    src_k = &ON_SurfaceCurvature::Nan;
    src_k_stride = 0;
  }
  if (this->CurvatureCapacity() >= vertex_capacity)
  {
    ON_SurfaceCurvature* k = m_K;
    ON_SurfaceCurvature* k1 = k + (m_K_stride * vertex_capacity);
    while (k < k1)
    {
      *k = *src_k;
      k += m_K_stride;
      src_k += src_k_stride;
    }
  }

  // copy src.m_C[] to m_C[]
  const ON_Color* src_c;
  size_t src_c_stride;
  if (C_count > 0)
  {
    src_c = src.m_C;
    src_c_stride = src.m_C_stride;
    SetColorsExistForExperts(true);
  }
  else
  {
    src_c = &ON_Color::UnsetColor;
    src_c_stride = 0;
  }
  if (this->ColorCapacity() >= vertex_capacity)
  {
    ON_Color* c = m_C;
    ON_Color* c1 = c + (m_C_stride * vertex_capacity);
    while (c < c1)
    {
      *c = *src_c;
      c += m_C_stride;
      src_c += src_c_stride;
    }
  }


}